

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

_Bool al_get_monitor_info(int adapter,ALLEGRO_MONITOR_INFO *info)

{
  _func_int *p_Var1;
  _func__Bool_int_ALLEGRO_MONITOR_INFO_ptr *UNRECOVERED_JUMPTABLE;
  _Bool _Var2;
  int iVar3;
  ALLEGRO_SYSTEM *pAVar4;
  ALLEGRO_SYSTEM *pAVar5;
  
  pAVar4 = al_get_system_driver();
  pAVar5 = al_get_system_driver();
  iVar3 = 0;
  if (((pAVar5 != (ALLEGRO_SYSTEM *)0x0) &&
      (iVar3 = 0, pAVar5->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (p_Var1 = pAVar5->vt->get_num_video_adapters, p_Var1 != (_func_int *)0x0)) {
    iVar3 = (*p_Var1)();
  }
  if (((pAVar4 != (ALLEGRO_SYSTEM *)0x0 && adapter < iVar3) &&
      (pAVar4->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = pAVar4->vt->get_monitor_info,
     UNRECOVERED_JUMPTABLE != (_func__Bool_int_ALLEGRO_MONITOR_INFO_ptr *)0x0)) {
    _Var2 = (*UNRECOVERED_JUMPTABLE)(adapter,info);
    return _Var2;
  }
  info->x1 = 0x7fffffff;
  info->y1 = 0x7fffffff;
  info->x2 = 0x7fffffff;
  info->y2 = 0x7fffffff;
  return false;
}

Assistant:

bool al_get_monitor_info(int adapter, ALLEGRO_MONITOR_INFO *info)
{
   ALLEGRO_SYSTEM *system = al_get_system_driver();

   if (adapter < al_get_num_video_adapters()) {
      if (system && system->vt && system->vt->get_monitor_info) {
         return system->vt->get_monitor_info(adapter, info);
      }
   }

   info->x1 = info->y1 = info->x2 = info->y2 = INT_MAX;
   return false;
}